

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(WordTagger *this,WordTagger *from)

{
  uint32 uVar1;
  TagsCase TVar2;
  LogMessage *other;
  long lVar3;
  string *psVar4;
  StringVector *this_00;
  StringVector *from_00;
  InternalMetadataWithArenaLite *this_01;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  WordTagger *local_58;
  WordTagger *from_local;
  WordTagger *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/WordTagger.pb.cc"
               ,0x20a);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (WordTagger *)&local_58->_internal_metadata_;
  local_40 = this_01;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_01,&local_20->unknown_fields);
  }
  language_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->language_,psVar4,(local_58->language_).ptr_);
  }
  tokensoutputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokensoutputfeaturename_,psVar4,(local_58->tokensoutputfeaturename_).ptr_);
  }
  tokentagsoutputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokentagsoutputfeaturename_,psVar4,
               (local_58->tokentagsoutputfeaturename_).ptr_);
  }
  tokenlocationsoutputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokenlocationsoutputfeaturename_,psVar4,
               (local_58->tokenlocationsoutputfeaturename_).ptr_);
  }
  tokenlengthsoutputfeaturename_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokenlengthsoutputfeaturename_,psVar4,
               (local_58->tokenlengthsoutputfeaturename_).ptr_);
  }
  modelparameterdata_abi_cxx11_(local_58);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->modelparameterdata_,psVar4,(local_58->modelparameterdata_).ptr_);
  }
  uVar1 = revision(local_58);
  if (uVar1 != 0) {
    uVar1 = revision(local_58);
    set_revision(this,uVar1);
  }
  TVar2 = Tags_case(local_58);
  if ((TVar2 != TAGS_NOT_SET) && (TVar2 == kStringTags)) {
    this_00 = mutable_stringtags(this);
    from_00 = stringtags(local_58);
    StringVector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void WordTagger::MergeFrom(const WordTagger& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.WordTagger)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.language().size() > 0) {

    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  if (from.tokensoutputfeaturename().size() > 0) {

    tokensoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokensoutputfeaturename_);
  }
  if (from.tokentagsoutputfeaturename().size() > 0) {

    tokentagsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokentagsoutputfeaturename_);
  }
  if (from.tokenlocationsoutputfeaturename().size() > 0) {

    tokenlocationsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlocationsoutputfeaturename_);
  }
  if (from.tokenlengthsoutputfeaturename().size() > 0) {

    tokenlengthsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlengthsoutputfeaturename_);
  }
  if (from.modelparameterdata().size() > 0) {

    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  if (from.revision() != 0) {
    set_revision(from.revision());
  }
  switch (from.Tags_case()) {
    case kStringTags: {
      mutable_stringtags()->::CoreML::Specification::StringVector::MergeFrom(from.stringtags());
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
}